

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

asn_enc_rval_t *
SET_OF_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                 int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  void *pvVar3;
  char *__s;
  ssize_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 *__base;
  size_t sVar10;
  char *__s_00;
  long lVar11;
  asn_app_consume_bytes_f *paVar12;
  size_t __nmemb;
  undefined8 *puVar13;
  bool bVar14;
  long local_b8;
  size_t local_a8;
  asn_enc_rval_t local_48;
  
  paVar1 = td->elements;
  pvVar2 = td->specifics;
  if (*(int *)((long)pvVar2 + 8) == 0) {
    __s_00 = paVar1->name;
    if (*__s_00 == '\0') {
      __s_00 = paVar1->type->xml_tag;
    }
  }
  else {
    __s_00 = (char *)0x0;
  }
  if (__s_00 == (char *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = strlen(__s_00);
  }
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  if ((flags & XER_F_CANONICAL) == 0) {
    __base = (undefined8 *)0x0;
    paVar12 = cb;
  }
  else {
    __base = (undefined8 *)malloc((long)*(int *)((long)sptr + 8) * 0x18);
    if (__base == (undefined8 *)0x0) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      return __return_storage_ptr__;
    }
    paVar12 = SET_OF_encode_xer_callback;
  }
  puVar13 = (undefined8 *)app_key;
  if (*(int *)((long)sptr + 8) < 1) {
    __nmemb = 0;
    local_b8 = 0;
  }
  else {
    iVar9 = 0;
    if (0 < ilevel) {
      iVar9 = ilevel;
    }
    iVar8 = -1;
    if (-1 < ilevel) {
      iVar8 = ilevel;
    }
    lVar11 = 0;
    local_b8 = 0;
    __nmemb = 0;
    do {
      pvVar3 = *(void **)(*sptr + lVar11 * 8);
      if (pvVar3 == (void *)0x0) {
        iVar7 = 8;
      }
      else {
        if (__base != (undefined8 *)0x0) {
          puVar13 = __base + __nmemb * 3;
          *puVar13 = 0;
          puVar13[1] = 0;
          puVar13[2] = 0;
          __nmemb = __nmemb + 1;
        }
        if (__s_00 != (char *)0x0) {
          if ((flags & XER_F_CANONICAL) == 0) {
            iVar5 = (*paVar12)("\n",1,puVar13);
            iVar7 = 0xd;
            if (iVar5 < 0) {
              bVar14 = false;
              iVar7 = 0xd;
            }
            else {
              iVar5 = ilevel;
              if (0 < ilevel) {
                do {
                  iVar6 = (*paVar12)("    ",4,puVar13);
                  if (iVar6 < 0) {
                    bVar14 = false;
                    goto LAB_00146c1d;
                  }
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
              }
              local_b8 = local_b8 + (ulong)(iVar9 * 4 + 1);
              iVar7 = 0;
              bVar14 = true;
            }
LAB_00146c1d:
            if (!bVar14) goto LAB_00146e81;
          }
          iVar7 = (*paVar12)("<",1,puVar13);
          if (((iVar7 < 0) || (iVar7 = (*paVar12)(__s_00,local_a8,puVar13), iVar7 < 0)) ||
             (iVar7 = (*paVar12)(">",1,puVar13), iVar7 < 0)) {
            iVar7 = 0xd;
            goto LAB_00146e81;
          }
        }
        if (((flags & XER_F_CANONICAL) == 0) && (*(int *)((long)pvVar2 + 8) == 1)) {
          iVar5 = (*paVar12)("\n",1,puVar13);
          iVar7 = 0xd;
          if (iVar5 < 0) {
            bVar14 = false;
            iVar7 = 0xd;
          }
          else {
            iVar5 = iVar8 + 1;
            if (-1 < ilevel) {
              do {
                iVar6 = (*paVar12)("    ",4,puVar13);
                if (iVar6 < 0) {
                  bVar14 = false;
                  goto LAB_00146d04;
                }
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            local_b8 = local_b8 + (iVar8 * 4 + 5);
            iVar7 = 0;
            bVar14 = true;
          }
LAB_00146d04:
          if (!bVar14) goto LAB_00146e81;
        }
        (*paVar1->type->xer_encoder)
                  (&local_48,paVar1->type,pvVar3,(uint)(*(int *)((long)pvVar2 + 8) != 2) + ilevel,
                   flags,paVar12,puVar13);
        sVar4 = local_48.encoded;
        iVar5 = 0xd;
        iVar7 = 0xd;
        if (local_48.encoded != -1) {
          if ((local_48.encoded == 0) && (*(int *)((long)pvVar2 + 8) != 0)) {
            __s = paVar1->type->xml_tag;
            sVar10 = strlen(__s);
            iVar7 = (*paVar12)("<",1,puVar13);
            if (iVar7 < 0) {
              bVar14 = false;
              iVar7 = 0xd;
            }
            else {
              iVar7 = (*paVar12)(__s,sVar10,puVar13);
              if (iVar7 < 0) {
                bVar14 = false;
                iVar7 = 0xd;
              }
              else {
                iVar7 = (*paVar12)("/>",2,puVar13);
                bVar14 = -1 < iVar7;
                iVar7 = 0xd;
                if (bVar14) {
                  iVar7 = 0;
                }
              }
            }
            if (!bVar14) goto LAB_00146e81;
          }
          if (__s_00 != (char *)0x0) {
            iVar6 = (*paVar12)("</",2,puVar13);
            iVar7 = iVar5;
            if (((iVar6 < 0) || (iVar5 = (*paVar12)(__s_00,local_a8,puVar13), iVar5 < 0)) ||
               (iVar5 = (*paVar12)(">",1,puVar13), iVar5 < 0)) goto LAB_00146e81;
            local_b8 = local_b8 + 5;
          }
          local_b8 = local_b8 + sVar4 + local_a8 * 2;
          iVar7 = 0;
        }
      }
LAB_00146e81:
      if ((iVar7 != 0) && (iVar7 != 8)) goto joined_r0x00146fbe;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)((long)sptr + 8));
  }
  if ((flags & XER_F_CANONICAL) == 0) {
    iVar8 = (*paVar12)("\n",1,puVar13);
    iVar9 = 0xd;
    if (-1 < iVar8) {
      iVar8 = 1;
      if (1 < ilevel) {
        iVar8 = ilevel;
      }
      iVar7 = iVar8 + -1;
      if (1 < ilevel) {
        do {
          iVar5 = (*paVar12)("    ",4,puVar13);
          iVar9 = 0xd;
          if (iVar5 < 0) goto LAB_00146f33;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      local_b8 = local_b8 + ((iVar8 + -1) * 4 + 1);
      iVar9 = 0;
    }
LAB_00146f33:
    if (iVar9 == 0xd) {
      local_b8 = -1;
      goto LAB_00147015;
    }
    if (iVar9 != 0) {
      return __return_storage_ptr__;
    }
  }
  if (__base != (undefined8 *)0x0) {
    qsort(__base,__nmemb,0x18,SET_OF_xer_order);
    iVar7 = 0;
    if (0 < (long)__nmemb) {
      puVar13 = __base;
      do {
        iVar9 = (*cb)((void *)*puVar13,puVar13[1],app_key);
        if (iVar9 < 0) {
          iVar7 = 0xd;
          break;
        }
        free((void *)*puVar13);
        *puVar13 = 0;
        puVar13 = puVar13 + 3;
      } while (puVar13 < __base + __nmemb * 3);
    }
    if (iVar7 != 0) {
joined_r0x00146fbe:
      if (iVar7 != 0xd) {
        return __return_storage_ptr__;
      }
      local_b8 = -1;
    }
  }
LAB_00147015:
  if (__base != (undefined8 *)0x0) {
    if (__nmemb != 0) {
      puVar13 = __base + __nmemb * 3;
      do {
        puVar13 = puVar13 + -3;
        if ((void *)*puVar13 != (void *)0x0) {
          free((void *)*puVar13);
        }
        __nmemb = __nmemb - 1;
      } while (__nmemb != 0);
    }
    free(__base);
  }
  __return_storage_ptr__->encoded = local_b8;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(sptr);
	const char *mname = specs->as_XMLValueList
		? 0 : ((*elm->name) ? elm->name : elm->type->xml_tag);
	size_t mlen = mname ? strlen(mname) : 0;
	int xcan = (flags & XER_F_CANONICAL);
	xer_tmp_enc_t *encs = 0;
	size_t encs_count = 0;
	void *original_app_key = app_key;
	asn_app_consume_bytes_f *original_cb = cb;
	int i;

	if(!sptr) ASN__ENCODE_FAILED;

	if(xcan) {
		encs = (xer_tmp_enc_t *)MALLOC(list->count * sizeof(encs[0]));
		if(!encs) ASN__ENCODE_FAILED;
		cb = SET_OF_encode_xer_callback;
	}

	er.encoded = 0;

	for(i = 0; i < list->count; i++) {
		asn_enc_rval_t tmper;

		void *memb_ptr = list->array[i];
		if(!memb_ptr) continue;

		if(encs) {
			memset(&encs[encs_count], 0, sizeof(encs[0]));
			app_key = &encs[encs_count];
			encs_count++;
		}

		if(mname) {
			if(!xcan) ASN__TEXT_INDENT(1, ilevel);
			ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);
		}

		if(!xcan && specs->as_XMLValueList == 1)
			ASN__TEXT_INDENT(1, ilevel + 1);
		tmper = elm->type->xer_encoder(elm->type, memb_ptr,
				ilevel + (specs->as_XMLValueList != 2),
				flags, cb, app_key);
		if(tmper.encoded == -1) {
			td = tmper.failed_type;
			sptr = tmper.structure_ptr;
			goto cb_failed;
		}
		if(tmper.encoded == 0 && specs->as_XMLValueList) {
			const char *name = elm->type->xml_tag;
			size_t len = strlen(name);
			ASN__CALLBACK3("<", 1, name, len, "/>", 2);
		}

		if(mname) {
			ASN__CALLBACK3("</", 2, mname, mlen, ">", 1);
			er.encoded += 5;
		}

		er.encoded += (2 * mlen) + tmper.encoded;
	}

	if(!xcan) ASN__TEXT_INDENT(1, ilevel - 1);

	if(encs) {
		xer_tmp_enc_t *enc = encs;
		xer_tmp_enc_t *end = encs + encs_count;
		ssize_t control_size = 0;

		cb = original_cb;
		app_key = original_app_key;
		qsort(encs, encs_count, sizeof(encs[0]), SET_OF_xer_order);

		for(; enc < end; enc++) {
			ASN__CALLBACK(enc->buffer, enc->offset);
			FREEMEM(enc->buffer);
			enc->buffer = 0;
			control_size += enc->offset;
		}
		assert(control_size == er.encoded);
	}

	goto cleanup;
cb_failed:
	er.encoded = -1;
	er.failed_type = td;
	er.structure_ptr = sptr;
cleanup:
	if(encs) {
		while(encs_count-- > 0) {
			if(encs[encs_count].buffer)
				FREEMEM(encs[encs_count].buffer);
		}
		FREEMEM(encs);
	}
	ASN__ENCODED_OK(er);
}